

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O1

parser_error parse_graf_directory(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *leaf;
  
  pvVar2 = parser_priv(p);
  leaf = parser_getsym(p,"dirname");
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    path_build((char *)((long)pvVar2 + 0x10),0x100,ANGBAND_DIR_TILES,leaf);
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_graf_directory(struct parser *p) {
	graphics_mode *mode = parser_priv(p);
	const char *dir = parser_getsym(p, "dirname");
	if (!mode) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Build a usable path */
	path_build(mode->path, sizeof(mode->path), ANGBAND_DIR_TILES, dir);

	return PARSE_ERROR_NONE;
}